

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qlistwidget.cpp
# Opt level: O3

void QListWidget::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  int *piVar1;
  code *pcVar2;
  long lVar3;
  int iVar4;
  ScrollHint hint;
  QListWidgetItem *item;
  long in_FS_OFFSET;
  undefined8 local_40;
  QModelIndex local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    break;
  case ReadProperty:
    piVar1 = (int *)*_a;
    if (_id == 2) {
      *(undefined1 *)piVar1 = *(undefined1 *)(*(long *)(_o + 8) + 0x5c0);
    }
    else {
      if (_id == 1) {
        QAbstractItemView::currentIndex(&local_38,(QAbstractItemView *)_o);
        iVar4 = local_38.r;
      }
      else {
        if (_id != 0) goto switchD_0057e16f_caseD_3;
        local_38.r = -1;
        local_38.c = -1;
        local_38.i = 0;
        local_38.m.ptr = (QAbstractItemModel *)0x0;
        iVar4 = (**(code **)(**(long **)(*(long *)(_o + 8) + 0x2f8) + 0x78))();
      }
      *piVar1 = iVar4;
    }
    goto switchD_0057e16f_caseD_3;
  case WriteProperty:
    if (_id == 2) {
      *(char *)(*(long *)(_o + 8) + 0x5c0) = (char)**_a;
    }
    else if (_id == 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setCurrentRow((QListWidget *)_o,**_a);
        return;
      }
      goto LAB_0057e5ef;
    }
  default:
    goto switchD_0057e16f_caseD_3;
  case IndexOfMethod:
    pcVar2 = *_a[1];
    lVar3 = *(long *)((long)_a[1] + 8);
    if (pcVar2 == itemPressed && lVar3 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (pcVar2 == itemClicked && lVar3 == 0) {
      *(undefined4 *)*_a = 1;
    }
    else if (pcVar2 == itemDoubleClicked && lVar3 == 0) {
      *(undefined4 *)*_a = 2;
    }
    else if (pcVar2 == itemActivated && lVar3 == 0) {
      *(undefined4 *)*_a = 3;
    }
    else if (pcVar2 == itemEntered && lVar3 == 0) {
      *(undefined4 *)*_a = 4;
    }
    else if (pcVar2 == itemChanged && lVar3 == 0) {
      *(undefined4 *)*_a = 5;
    }
    else if (pcVar2 == currentItemChanged && lVar3 == 0) {
      *(undefined4 *)*_a = 6;
    }
    else if (pcVar2 == currentTextChanged && lVar3 == 0) {
      *(undefined4 *)*_a = 7;
    }
    else if (pcVar2 == currentRowChanged && lVar3 == 0) {
      *(undefined4 *)*_a = 8;
    }
    else if (pcVar2 == itemSelectionChanged && lVar3 == 0) {
      *(undefined4 *)*_a = 9;
    }
    goto switchD_0057e16f_caseD_3;
  }
  switch(_id) {
  case 0:
    local_40 = *_a[1];
    local_38.i = (quintptr)&local_40;
    iVar4 = 0;
    break;
  case 1:
    local_40 = *_a[1];
    local_38.i = (quintptr)&local_40;
    iVar4 = 1;
    break;
  case 2:
    local_40 = *_a[1];
    local_38.i = (quintptr)&local_40;
    iVar4 = 2;
    break;
  case 3:
    local_40 = *_a[1];
    local_38.i = (quintptr)&local_40;
    iVar4 = 3;
    break;
  case 4:
    local_40 = *_a[1];
    local_38.i = (quintptr)&local_40;
    iVar4 = 4;
    break;
  case 5:
    local_40 = *_a[1];
    local_38.i = (quintptr)&local_40;
    iVar4 = 5;
    break;
  case 6:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      currentItemChanged((QListWidget *)_o,*_a[1],*_a[2]);
      return;
    }
    goto LAB_0057e5ef;
  case 7:
    local_38.i = (quintptr)_a[1];
    iVar4 = 7;
    break;
  case 8:
    local_38.i = (quintptr)&local_40;
    local_40 = CONCAT44(local_40._4_4_,*_a[1]);
    iVar4 = 8;
    break;
  case 9:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      QMetaObject::activate(_o,&staticMetaObject,9,(void **)0x0);
      return;
    }
    goto LAB_0057e5ef;
  case 10:
    item = *_a[1];
    hint = *_a[2];
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
LAB_0057e4f0:
      scrollToItem((QListWidget *)_o,item,hint);
      return;
    }
    goto LAB_0057e5ef;
  case 0xb:
    item = *_a[1];
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      hint = EnsureVisible;
      goto LAB_0057e4f0;
    }
    goto LAB_0057e5ef;
  case 0xc:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      clear((QListWidget *)_o);
      return;
    }
    goto LAB_0057e5ef;
  default:
    goto switchD_0057e16f_caseD_3;
  }
  local_38.r = 0;
  local_38.c = 0;
  QMetaObject::activate(_o,&staticMetaObject,iVar4,(void **)&local_38);
switchD_0057e16f_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_0057e5ef:
  __stack_chk_fail();
}

Assistant:

void QListWidget::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QListWidget *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->itemPressed((*reinterpret_cast< std::add_pointer_t<QListWidgetItem*>>(_a[1]))); break;
        case 1: _t->itemClicked((*reinterpret_cast< std::add_pointer_t<QListWidgetItem*>>(_a[1]))); break;
        case 2: _t->itemDoubleClicked((*reinterpret_cast< std::add_pointer_t<QListWidgetItem*>>(_a[1]))); break;
        case 3: _t->itemActivated((*reinterpret_cast< std::add_pointer_t<QListWidgetItem*>>(_a[1]))); break;
        case 4: _t->itemEntered((*reinterpret_cast< std::add_pointer_t<QListWidgetItem*>>(_a[1]))); break;
        case 5: _t->itemChanged((*reinterpret_cast< std::add_pointer_t<QListWidgetItem*>>(_a[1]))); break;
        case 6: _t->currentItemChanged((*reinterpret_cast< std::add_pointer_t<QListWidgetItem*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QListWidgetItem*>>(_a[2]))); break;
        case 7: _t->currentTextChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 8: _t->currentRowChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 9: _t->itemSelectionChanged(); break;
        case 10: _t->scrollToItem((*reinterpret_cast< std::add_pointer_t<const QListWidgetItem*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAbstractItemView::ScrollHint>>(_a[2]))); break;
        case 11: _t->scrollToItem((*reinterpret_cast< std::add_pointer_t<const QListWidgetItem*>>(_a[1]))); break;
        case 12: _t->clear(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QListWidget::*)(QListWidgetItem * )>(_a, &QListWidget::itemPressed, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QListWidget::*)(QListWidgetItem * )>(_a, &QListWidget::itemClicked, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QListWidget::*)(QListWidgetItem * )>(_a, &QListWidget::itemDoubleClicked, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QListWidget::*)(QListWidgetItem * )>(_a, &QListWidget::itemActivated, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QListWidget::*)(QListWidgetItem * )>(_a, &QListWidget::itemEntered, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QListWidget::*)(QListWidgetItem * )>(_a, &QListWidget::itemChanged, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QListWidget::*)(QListWidgetItem * , QListWidgetItem * )>(_a, &QListWidget::currentItemChanged, 6))
            return;
        if (QtMocHelpers::indexOfMethod<void (QListWidget::*)(const QString & )>(_a, &QListWidget::currentTextChanged, 7))
            return;
        if (QtMocHelpers::indexOfMethod<void (QListWidget::*)(int )>(_a, &QListWidget::currentRowChanged, 8))
            return;
        if (QtMocHelpers::indexOfMethod<void (QListWidget::*)()>(_a, &QListWidget::itemSelectionChanged, 9))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<int*>(_v) = _t->count(); break;
        case 1: *reinterpret_cast<int*>(_v) = _t->currentRow(); break;
        case 2: *reinterpret_cast<bool*>(_v) = _t->isSortingEnabled(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 1: _t->setCurrentRow(*reinterpret_cast<int*>(_v)); break;
        case 2: _t->setSortingEnabled(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}